

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

http_host_state http_parse_host_char(http_host_state s,char ch)

{
  char ch_local;
  http_host_state s_local;
  
  switch(s) {
  case s_http_userinfo_start:
  case s_http_userinfo:
    if (ch == '@') {
      return s_http_host_start;
    }
    if (((((((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) ||
           (('/' < ch && (ch < ':')))) ||
          ((((ch == '-' || (ch == '_')) || (ch == '.')) || ((ch == '!' || (ch == '~')))))) ||
         (ch == '*')) ||
        (((ch == '\'' || (ch == '(')) ||
         ((ch == ')' || (((ch == '%' || (ch == ';')) || (ch == ':')))))))) ||
       (((ch == '&' || (ch == '=')) || ((ch == '+' || ((ch == '$' || (ch == ',')))))))) {
      return s_http_userinfo;
    }
    break;
  case s_http_host_start:
    if (ch == '[') {
      return s_http_host_v6_start;
    }
    if ((((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) || (('/' < ch && (ch < ':'))))
       || ((ch == '.' || (ch == '-')))) {
      return s_http_host;
    }
    break;
  case s_http_host:
    if ((((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) || (('/' < ch && (ch < ':'))))
       || ((ch == '.' || (ch == '-')))) {
      return s_http_host;
    }
  case s_http_host_v6_end:
    if (ch == ':') {
      return s_http_host_port_start;
    }
    break;
  case s_http_host_v6:
    if (ch == ']') {
      return s_http_host_v6_end;
    }
  case s_http_host_v6_start:
    if (((('/' < ch) && (ch < ':')) || ((0x60 < (byte)(ch | 0x20U) && ((byte)(ch | 0x20U) < 0x67))))
       || ((ch == ':' || (ch == '.')))) {
      return s_http_host_v6;
    }
    if ((s == s_http_host_v6) && (ch == '%')) {
      return s_http_host_v6_zone_start;
    }
    break;
  case s_http_host_v6_zone:
    if (ch == ']') {
      return s_http_host_v6_end;
    }
  case s_http_host_v6_zone_start:
    if ((((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) || (('/' < ch && (ch < ':'))))
       || ((((ch == '%' || (ch == '.')) || (ch == '-')) || ((ch == '_' || (ch == '~')))))) {
      return s_http_host_v6_zone;
    }
    break;
  case s_http_host_port_start:
  case s_http_host_port:
    if (('/' < ch) && (ch < ':')) {
      return s_http_host_port;
    }
  }
  return s_http_host_dead;
}

Assistant:

static enum http_host_state
http_parse_host_char(enum http_host_state s, const char ch) {
  switch(s) {
    case s_http_userinfo:
    case s_http_userinfo_start:
      if (ch == '@') {
        return s_http_host_start;
      }

      if (IS_USERINFO_CHAR(ch)) {
        return s_http_userinfo;
      }
      break;

    case s_http_host_start:
      if (ch == '[') {
        return s_http_host_v6_start;
      }

      if (IS_HOST_CHAR(ch)) {
        return s_http_host;
      }

      break;

    case s_http_host:
      if (IS_HOST_CHAR(ch)) {
        return s_http_host;
      }

    /* fall through */
    case s_http_host_v6_end:
      if (ch == ':') {
        return s_http_host_port_start;
      }

      break;

    case s_http_host_v6:
      if (ch == ']') {
        return s_http_host_v6_end;
      }

    /* fall through */
    case s_http_host_v6_start:
      if (IS_HEX(ch) || ch == ':' || ch == '.') {
        return s_http_host_v6;
      }

      if (s == s_http_host_v6 && ch == '%') {
        return s_http_host_v6_zone_start;
      }
      break;

    case s_http_host_v6_zone:
      if (ch == ']') {
        return s_http_host_v6_end;
      }

    /* fall through */
    case s_http_host_v6_zone_start:
      /* RFC 6874 Zone ID consists of 1*( unreserved / pct-encoded) */
      if (IS_ALPHANUM(ch) || ch == '%' || ch == '.' || ch == '-' || ch == '_' ||
          ch == '~') {
        return s_http_host_v6_zone;
      }
      break;

    case s_http_host_port:
    case s_http_host_port_start:
      if (IS_NUM(ch)) {
        return s_http_host_port;
      }

      break;

    default:
      break;
  }
  return s_http_host_dead;
}